

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_stdcxx.h
# Opt level: O0

bool leveldb::port::Snappy_Compress(char *input,size_t length,string *output)

{
  string *output_local;
  size_t length_local;
  char *input_local;
  
  return false;
}

Assistant:

inline bool Snappy_Compress(const char* input, size_t length,
                            std::string* output) {
#if HAVE_SNAPPY
  output->resize(snappy::MaxCompressedLength(length));
  size_t outlen;
  snappy::RawCompress(input, length, &(*output)[0], &outlen);
  output->resize(outlen);
  return true;
#else
  // Silence compiler warnings about unused arguments.
  (void)input;
  (void)length;
  (void)output;
#endif  // HAVE_SNAPPY

  return false;
}